

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shop.cpp
# Opt level: O0

void __thiscall SHOPManagement::Shop::buyProduct(Shop *this,Customer *pCustomer)

{
  int iVar1;
  reference ppPVar2;
  Customer *this_00;
  longdouble in_ST0;
  longdouble in_ST1;
  bool local_59;
  longdouble new_balance;
  undefined1 local_30 [8];
  int new_quantity;
  int product_quantity;
  Product *pProduct;
  Customer *pCStack_18;
  int product_id;
  Customer *pCustomer_local;
  Shop *this_local;
  
  pProduct._4_4_ = 0xffffffff;
  pCStack_18 = pCustomer;
  pCustomer_local = (Customer *)this;
  std::operator<<((ostream *)&std::cout,"Product ID: ");
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&pProduct + 4));
  pProduct._4_4_ = searchProductById(this,(int *)((long)&pProduct + 4));
  if (pProduct._4_4_ == -1) {
    std::__cxx11::string::operator=((string *)Helper::m_message_abi_cxx11_,"Product was not found.")
    ;
  }
  else {
    ppPVar2 = std::vector<SHOPManagement::Product_*,_std::allocator<SHOPManagement::Product_*>_>::at
                        (&this->v_products,(long)pProduct._4_4_);
    _new_quantity = *ppPVar2;
    iVar1 = Product::getQuantity(_new_quantity);
    if (0 < iVar1) {
      do {
        std::operator<<((ostream *)&std::cout,"Quantity: ");
        std::istream::operator>>((istream *)&std::cin,(int *)(local_30 + 4));
        iVar1 = Product::getQuantity(_new_quantity);
        local_59 = iVar1 < (int)local_30._4_4_ || (int)local_30._4_4_ < 1;
      } while (local_59);
      local_30._0_4_ = Product::getQuantity(_new_quantity);
      local_30._0_4_ = local_30._0_4_ - local_30._4_4_;
      this_00 = (Customer *)local_30;
      Product::setQuantity(_new_quantity,(int *)this_00);
      Customer::getBalance((longdouble *)pCStack_18,this_00);
      Product::getPrice((longdouble *)_new_quantity,(Product *)this_00);
      Customer::setBalance(pCStack_18,in_ST0 + (longdouble)(int)local_30._4_4_ * in_ST1);
    }
  }
  return;
}

Assistant:

void Shop::buyProduct(Customer *pCustomer)
    {
        int product_id = -1;
        std::cout << "Product ID: ";
        std::cin >> product_id;

        product_id = searchProductById(product_id);

        if (product_id != -1)
        {
            Product *pProduct = this->v_products.at(product_id);

            if (pProduct->getQuantity() > 0)
            {
                int product_quantity;

                do
                {
                    std::cout << "Quantity: ";
                    std::cin >> product_quantity;
                } while (pProduct->getQuantity() < product_quantity || product_quantity < 1);

                int new_quantity = pProduct->getQuantity() - product_quantity;
                pProduct->setQuantity(new_quantity);
                long double new_balance = pCustomer->getBalance() + (pProduct->getPrice() * product_quantity);
                pCustomer->setBalance(new_balance);
            }
        }
        else
        {
            Helper::m_message = "Product was not found.";
        }
    }